

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  size_type sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  const_reference pUVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  int index;
  
  iVar4 = SooRep::size((SooRep *)unknown_fields,
                       (undefined1  [16])
                       ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                       (undefined1  [16])0x4) == (undefined1  [16])0x0);
  index = 0;
  if (iVar4 < 1) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
      switch(pUVar5->type_) {
      case 0:
        uVar8 = pUVar5->number_ * 8 + 1;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar9 = (pUVar5->data_).varint | 1;
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        sVar7 = ((int)lVar3 * 9 + 0x49U >> 6) + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        break;
      case 1:
        uVar8 = pUVar5->number_ * 8 + 5;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar4 * 9 + 0x49U >> 6) + 4;
        break;
      case 2:
        uVar8 = pUVar5->number_ * 8 + 1;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar4 * 9 + 0x49U >> 6) + 8;
        break;
      case 3:
        uVar8 = pUVar5->number_ * 8 + 3;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar1 = ((pUVar5->data_).string_value)->_M_string_length;
        uVar8 = (uint)sVar1 | 1;
        iVar2 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        sVar7 = sVar7 + sVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + (ulong)(iVar2 * 9 + 0x49U >> 6);
        break;
      case 4:
        uVar8 = pUVar5->number_ * 8 + 3;
        iVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar6 = ComputeUnknownFieldsSize((pUVar5->data_).group);
        uVar8 = pUVar5->number_ * 8 + 5;
        iVar2 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        sVar7 = sVar6 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6) + (ulong)(iVar2 * 9 + 0x49U >> 6);
      }
      index = index + 1;
      iVar4 = SooRep::size((SooRep *)unknown_fields,
                           (undefined1  [16])
                           ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
    } while (index < iVar4);
  }
  return sVar7;
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32_t);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64_t);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}